

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

void EncodeSetOrSequenceOf<AnyType>
               (DerType type,vector<AnyType,_std::allocator<AnyType>_> *in,uchar *pOut,size_t cbOut,
               size_t *cbUsed)

{
  bool bVar1;
  size_type sVar2;
  overflow_error *this;
  size_t size;
  out_of_range *this_00;
  reference this_01;
  uint local_5c;
  uint i;
  size_t cbVector;
  long local_40;
  size_t offset;
  size_t cbInternal;
  size_t *cbUsed_local;
  size_t cbOut_local;
  uchar *pOut_local;
  vector<AnyType,_std::allocator<AnyType>_> *in_local;
  DerType type_local;
  
  offset = 0;
  cbInternal = (size_t)cbUsed;
  cbUsed_local = (size_t *)cbOut;
  cbOut_local = (size_t)pOut;
  pOut_local = (uchar *)in;
  in_local._4_4_ = type;
  sVar2 = std::vector<AnyType,_std::allocator<AnyType>_>::size(in);
  if (sVar2 == 0) {
    if (cbUsed_local < (size_t *)0x2) {
      this = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(this,"Overflow in EncodeSetOrSequenceOf");
      __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    *(undefined1 *)cbOut_local = 5;
    *(undefined1 *)(cbOut_local + 1) = 0;
    *(undefined8 *)cbInternal = 2;
  }
  else {
    *(char *)cbOut_local = (char)in_local._4_4_;
    size = GetEncodedSize<AnyType>((vector<AnyType,_std::allocator<AnyType>_> *)pOut_local);
    bVar1 = EncodeSize(size,(uchar *)(cbOut_local + 1),(long)cbUsed_local - 1,&offset);
    if (!bVar1) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Error in EncodeSize");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    local_40 = offset + 1;
    local_5c = 0;
    while( true ) {
      sVar2 = std::vector<AnyType,_std::allocator<AnyType>_>::size
                        ((vector<AnyType,_std::allocator<AnyType>_> *)pOut_local);
      if (sVar2 <= local_5c) break;
      this_01 = std::vector<AnyType,_std::allocator<AnyType>_>::operator[]
                          ((vector<AnyType,_std::allocator<AnyType>_> *)pOut_local,(ulong)local_5c);
      AnyType::Encode(this_01,(uchar *)(cbOut_local + local_40),(long)cbUsed_local - local_40,
                      &offset);
      local_40 = offset + local_40;
      local_5c = local_5c + 1;
    }
    *(long *)cbInternal = local_40;
  }
  return;
}

Assistant:

void EncodeSetOrSequenceOf(DerType type, std::vector<T>& in, unsigned char * pOut, size_t cbOut, size_t & cbUsed)
{
	size_t cbInternal = 0;
	size_t offset = 0;

	if (in.size() == 0)
	{
		if (cbOut < 2)
			throw std::overflow_error("Overflow in EncodeSetOrSequenceOf");

		pOut[0] = static_cast<unsigned char>(DerType::Null);
		pOut[1] = 0;
		cbUsed = 2;
		return;
	}

	pOut[0] = static_cast<unsigned char>(type);

	size_t cbVector = GetEncodedSize(in);

	offset = 1;
	if (!EncodeSize(cbVector, pOut + offset, cbOut - offset, cbInternal))
		throw std::out_of_range("Error in EncodeSize");

	offset += cbInternal;

	for (unsigned int i = 0; i < in.size(); ++i)
	{
		in[i].Encode(pOut + offset, cbOut - offset, cbInternal);
		offset += cbInternal;
	}

	cbUsed = offset;
}